

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f __thiscall Quat4f::squadTangent(Quat4f *this,Quat4f *before,Quat4f *center,Quat4f *after)

{
  int i;
  long lVar1;
  Quat4f QVar2;
  Quat4f l2;
  Quat4f l1;
  Quat4f local_68;
  Quat4f local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  Quat4f local_30;
  
  logDifference(&local_58,center,before);
  logDifference(&local_68,center,after);
  this->m_elements[0] = 0.0;
  this->m_elements[1] = 0.0;
  this->m_elements[2] = 0.0;
  this->m_elements[3] = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->m_elements[lVar1] = (local_58.m_elements[lVar1] + local_68.m_elements[lVar1]) * -0.25;
  }
  exp(&local_30,SUB648(ZEXT464(0xbe800000),0));
  QVar2 = ::operator*(center,&local_30);
  *(undefined8 *)this->m_elements = local_48;
  *(undefined8 *)(this->m_elements + 2) = uStack_40;
  QVar2.m_elements[0] = (float)(undefined4)local_48;
  QVar2.m_elements[1] = (float)local_48._4_4_;
  return (Quat4f)QVar2.m_elements;
}

Assistant:

Quat4f Quat4f::squadTangent( const Quat4f& before, const Quat4f& center, const Quat4f& after )
{
	Quat4f l1 = Quat4f::logDifference( center, before );
	Quat4f l2 = Quat4f::logDifference( center, after );
	
	Quat4f e;
	for( int i = 0; i < 4; ++i )
	{
		e[ i ] = -0.25f * ( l1[ i ] + l2[ i ] );
	}
	e = center * ( e.exp() );

	return e;
}